

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Slice __thiscall leveldb::Version::LevelFileNumIterator::value(LevelFileNumIterator *this)

{
  uint uVar1;
  const_reference ppFVar2;
  LevelFileNumIterator *this_local;
  
  uVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((uVar1 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0xc3,"virtual Slice leveldb::Version::LevelFileNumIterator::value() const");
  }
  ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
            operator[](this->flist_,(ulong)this->index_);
  EncodeFixed64(this->value_buf_,(*ppFVar2)->number);
  ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
            operator[](this->flist_,(ulong)this->index_);
  EncodeFixed64(this->value_buf_ + 8,(*ppFVar2)->file_size);
  Slice::Slice((Slice *)&this_local,this->value_buf_,0x10);
  return _this_local;
}

Assistant:

Slice value() const override {
    assert(Valid());
    EncodeFixed64(value_buf_, (*flist_)[index_]->number);
    EncodeFixed64(value_buf_ + 8, (*flist_)[index_]->file_size);
    return Slice(value_buf_, sizeof(value_buf_));
  }